

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha0_ia32aes_b.h
# Opt level: O1

uint64_t t1ha0_ia32aes_avx2(void *data,size_t len,uint64_t seed)

{
  sbyte sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 *puVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  uint64_t a;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  uint64_t b;
  size_t sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  __m128i salt;
  undefined1 auVar13 [64];
  
  sVar11 = len;
  if (0x20 < len) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = seed;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = len;
    auVar12 = vpunpcklqdq_avx(auVar14,auVar12);
    auVar14 = aesenc(auVar12,_DAT_0018bc50);
    pauVar7 = (undefined1 (*) [16])((len & 0xfffffffffffffff0) + (long)data);
    if ((len & 0x10) != 0) {
      auVar12 = vpaddq_avx(auVar12,*data);
      data = (void *)((long)data + 0x10);
      auVar14 = aesenc(auVar12,auVar14);
    }
    pauVar6 = (undefined1 (*) [16])((long)data + 0x70);
    auVar17 = auVar14;
    while( true ) {
      auVar16 = ZEXT1664(auVar17);
      auVar13 = ZEXT1664(auVar12);
      if (pauVar7 <= pauVar6) break;
      auVar15 = aesenc(*data,auVar14);
      auVar15 = aesdec(auVar15,*(undefined1 (*) [16])((long)data + 0x10));
      auVar15 = aesdec(auVar15,*(undefined1 (*) [16])((long)data + 0x20));
      auVar15 = aesdec(auVar15,*(undefined1 (*) [16])((long)data + 0x30));
      auVar15 = aesdec(auVar15,*(undefined1 (*) [16])((long)data + 0x40));
      auVar15 = aesdec(auVar15,*(undefined1 (*) [16])((long)data + 0x50));
      auVar15 = aesdec(auVar15,*(undefined1 (*) [16])((long)data + 0x60));
      auVar15 = aesdec(auVar15,*(undefined1 (*) [16])((long)data + 0x70));
      auVar14 = vpaddq_avx(auVar14,_DAT_0018bc60);
      auVar15 = aesenc(auVar12,auVar15);
      auVar12 = vpaddq_avx(auVar12,auVar17);
      pauVar6 = (undefined1 (*) [16])((long)data + 0xf0);
      data = (undefined1 (*) [16])((long)data + 0x80);
      auVar17 = auVar15;
    }
    len = (size_t)((uint)len & 0xf);
    while( true ) {
      auVar14 = auVar16._0_16_;
      auVar12 = auVar13._0_16_;
      if (pauVar7 <= data) break;
      auVar17 = vpaddq_avx(auVar14,*data);
      auVar15 = vpsubq_avx(auVar12,*(undefined1 (*) [16])((long)data + 0x10));
      data = (void *)((long)data + 0x20);
      auVar12 = aesdec(auVar12,auVar17);
      auVar13._0_32_ = ZEXT1632(auVar12);
      auVar12 = aesdec(auVar14,auVar15);
      auVar16._0_32_ = ZEXT1632(auVar12);
    }
    auVar17 = aesenc(auVar14,auVar12);
    auVar12 = aesdec(auVar12,auVar17);
    auVar12 = vpaddq_avx(auVar12,auVar14);
    seed = auVar12._0_8_;
    sVar11 = vpextrq_avx(auVar12,1);
    data = pauVar7;
  }
  switch(len) {
  default:
    puVar5 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(long *)puVar5 + sVar11;
    seed = seed ^ SUB168(auVar17 * ZEXT816(0x9c06faf4d023e3ab),0);
    sVar11 = sVar11 + SUB168(auVar17 * ZEXT816(0x9c06faf4d023e3ab),8);
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    puVar5 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(long *)puVar5 + seed;
    sVar11 = sVar11 ^ SUB168(auVar15 * ZEXT816(0xbd9cacc22c6e9571),0);
    seed = seed + SUB168(auVar15 * ZEXT816(0xbd9cacc22c6e9571),8);
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    puVar5 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(long *)puVar5 + sVar11;
    seed = seed ^ SUB168(auVar2 * ZEXT816(0xd4f06db99d67be4b),0);
    sVar11 = sVar11 + SUB168(auVar2 * ZEXT816(0xd4f06db99d67be4b),8);
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar10 = -(int)len & 7;
    if (((ulong)data & 0xff8) == 0) {
      bVar9 = (char)uVar10 * -8 + 0x40;
      sVar1 = (bVar9 < 0x41) * ('@' - bVar9);
      uVar8 = (ulong)(*(long *)*(undefined1 (*) [16])data << sVar1) >> sVar1;
    }
    else {
      uVar8 = *(ulong *)((long)data - (ulong)uVar10) >> (ulong)(uVar10 * 8);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8 + seed;
    sVar11 = sVar11 ^ SUB168(auVar3 * ZEXT816(0x82434fe90edcef39),0);
    seed = seed + SUB168(auVar3 * ZEXT816(0x82434fe90edcef39),8);
  case 0:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = ((seed >> 0x17 | seed << 0x29) + sVar11) * -0x34a50ac51c5553cf ^
                   ((sVar11 >> 0x29 | sVar11 << 0x17) + seed) * -0x136640f27c8d3555;
    return SUB168(auVar4 * ZEXT816(0xc060724a8424f345),8) ^
           SUB168(auVar4 * ZEXT816(0xc060724a8424f345),0);
  }
}

Assistant:

uint64_t T1HA_IA32AES_NAME(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  if (unlikely(len > 32)) {
    __m128i x = _mm_set_epi64x(a, b);
    __m128i y = _mm_aesenc_si128(x, _mm_set_epi64x(prime_0, prime_1));

    const __m128i *v = (const __m128i *)data;
    const __m128i *const detent =
        (const __m128i *)((const uint8_t *)data + (len & ~15ul));
    data = detent;

    if (len & 16) {
      x = _mm_add_epi64(x, _mm_loadu_si128(v++));
      y = _mm_aesenc_si128(x, y);
    }
    len &= 15;

    if (v + 7 < detent) {
      __m128i salt = y;
      do {
        __m128i t = _mm_aesenc_si128(_mm_loadu_si128(v++), salt);
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));

        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));

        salt = _mm_add_epi64(salt, _mm_set_epi64x(prime_5, prime_6));
        t = _mm_aesenc_si128(x, t);
        x = _mm_add_epi64(y, x);
        y = t;
      } while (v + 7 < detent);
    }

    while (v < detent) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);
    }

    x = _mm_add_epi64(_mm_aesdec_si128(x, _mm_aesenc_si128(y, x)), y);
#if defined(__x86_64__) || defined(_M_X64)
#if defined(__SSE4_1__) || defined(__AVX__)
    a = _mm_extract_epi64(x, 0);
    b = _mm_extract_epi64(x, 1);
#else
    a = _mm_cvtsi128_si64(x);
    b = _mm_cvtsi128_si64(_mm_unpackhi_epi64(x, x));
#endif
#else
#if defined(__SSE4_1__) || defined(__AVX__)
    a = (uint32_t)_mm_extract_epi32(x, 0) | (uint64_t)_mm_extract_epi32(x, 1)
                                                << 32;
    b = (uint32_t)_mm_extract_epi32(x, 2) | (uint64_t)_mm_extract_epi32(x, 3)
                                                << 32;
#else
    a = (uint32_t)_mm_cvtsi128_si32(x);
    a |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
    x = _mm_unpackhi_epi64(x, x);
    b = (uint32_t)_mm_cvtsi128_si32(x);
    b |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
#endif
#endif
#ifdef __AVX__
    _mm256_zeroall();
#elif !(defined(_X86_64_) || defined(__x86_64__) || defined(_M_X64))
    _mm_empty();
#endif
  }

  const uint64_t *v = (const uint64_t *)data;
  switch (len) {
  default:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_4);
  /* fall through */
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    mixup64(&b, &a, fetch64_le_unaligned(v++), prime_3);
  /* fall through */
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_2);
  /* fall through */
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    mixup64(&b, &a, tail64_le_unaligned(v, len), prime_1);
  /* fall through */
  case 0:
    return final64(a, b);
  }
}